

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  DistributionMapping *dm;
  _func_int **pp_Var1;
  FabFactory<amrex::FArrayBox> *factory;
  pointer pSVar2;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> factory_00;
  FArrayBox *pFVar3;
  FArrayBox *__args_4;
  AmrLevel *pAVar4;
  Box *pBVar5;
  Geometry *pGVar6;
  Real *pRVar7;
  bool bVar8;
  IndexType typ;
  int iVar9;
  int iVar10;
  MultiFab *this_00;
  DeriveRec *pDVar11;
  DeriveBoxMap p_Var12;
  FabArrayBase *fabarray_;
  int *piVar13;
  long lVar14;
  pointer *ppbVar15;
  pointer *ppbVar16;
  DeriveFunc p_Var17;
  DeriveFunc3D p_Var18;
  int *piVar19;
  int ngrow;
  BoxArray *rhs;
  int dcomp;
  long lVar20;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  FabArrayBase *local_378;
  int scomp;
  int *local_368;
  AmrLevel *local_360;
  DeriveRec *local_358;
  int ncomp;
  Box *local_348;
  AmrLevel *local_340;
  int n_state;
  int n_der;
  int grid_no;
  Geometry *local_328;
  Box bx1;
  pointer pbStack_300;
  int local_2f8;
  Vector<int,_std::allocator<int>_> *local_2e8;
  Vector<int,_std::allocator<int>_> *local_2e0;
  int *local_2c0;
  Real *local_2b8;
  Box *local_2b0;
  IntVect *local_2a8;
  double *local_2a0;
  double *local_298;
  Real dt;
  Real time_local;
  Box local_27c;
  RealBox *local_260;
  DeriveFunc local_258;
  int *local_250;
  RealBox temp;
  BoxArray dstBA;
  MultiFab srcMF;
  
  local_368 = (int *)CONCAT44(local_368._4_4_,(int)keylen);
  local_348 = (Box *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  this->_vptr_AmrLevel = (_func_int **)0x0;
  local_340 = this;
  bVar8 = isStateVariable((string *)key,&index,&scomp);
  if (bVar8) {
    lVar20 = (long)index;
    lVar14 = *(long *)(ctx + 0x170);
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1
    ;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
    factory = *(FabFactory<amrex::FArrayBox> **)(ctx + 0x218);
    this_00 = (MultiFab *)operator_new(0x180);
    iVar9 = (int)local_368;
    MultiFab::MultiFab(this_00,(BoxArray *)(lVar14 + lVar20 * 0xe0 + 0x30),
                       (DistributionMapping *)(ctx + 0x140),1,(int)local_368,(MFInfo *)&srcMF,
                       factory);
    pAVar4 = local_340;
    local_340->_vptr_AmrLevel = (_func_int **)this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ);
    FillPatch((AmrLevel *)ctx,this_00,iVar9,(Real)local_348,index,scomp,1,0);
    local_340 = pAVar4;
  }
  else {
    local_360 = (AmrLevel *)ctx;
    pDVar11 = DeriveList::get((DeriveList *)&derive_lst,(string *)key);
    if (pDVar11 == (DeriveRec *)0x0) {
      pp_Var1 = (_func_int **)
                ((long)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                        m_op + 4);
      srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ","");
      std::__cxx11::string::_M_append((char *)&srcMF,*(ulong *)key);
      Error_host((char *)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase);
      if (srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase != pp_Var1) {
        operator_delete(srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                        ,srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                         m_op._4_8_ + 1);
      }
    }
    else {
      DeriveRec::getRange(pDVar11,0,&index,&scomp,&ncomp);
      iVar9 = index;
      pSVar2 = (local_360->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      rhs = (BoxArray *)((long)(pSVar2 + index) + 0x30);
      local_358 = pDVar11;
      BoxArray::BoxArray(&dstBA,rhs);
      pDVar11 = local_358;
      typ = DeriveRec::deriveType(local_358);
      BoxArray::convert(&dstBA,typ);
      BATransformer::operator()
                ((Box *)&srcMF,(BATransformer *)rhs,
                 (Box *)**(undefined8 **)((long)(pSVar2 + iVar9) + 0x78));
      p_Var12 = DeriveRec::boxMap(pDVar11);
      (*p_Var12)(&bx1,(Box *)&srcMF);
      pAVar4 = local_360;
      ngrow = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
              bx1.smallend.vect[0]) + (int)local_368;
      dm = &local_360->dmap;
      iVar9 = DeriveRec::numState(pDVar11);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffcf8 = (pointer)0x0;
      pbStack_300 = (pointer)0x0;
      local_378 = (FabArrayBase *)dm;
      MultiFab::MultiFab(&srcMF,rhs,dm,iVar9,ngrow,(MFInfo *)&bx1,
                         (pAVar4->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      iVar9 = DeriveRec::numRange(pDVar11);
      if (0 < iVar9) {
        iVar9 = 0;
        dcomp = 0;
        do {
          DeriveRec::getRange(pDVar11,iVar9,&index,&scomp,&ncomp);
          FillPatch(local_360,&srcMF,ngrow,(Real)local_348,index,scomp,ncomp,dcomp);
          pDVar11 = local_358;
          iVar9 = iVar9 + 1;
          dcomp = dcomp + ncomp;
          iVar10 = DeriveRec::numRange(local_358);
        } while (iVar9 < iVar10);
      }
      iVar9 = DeriveRec::numDerive(pDVar11);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffcf8 = (pointer)0x0;
      pbStack_300 = (pointer)0x0;
      factory_00._M_head_impl =
           (local_360->m_factory)._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
      fabarray_ = (FabArrayBase *)operator_new(0x180);
      MultiFab::MultiFab((MultiFab *)fabarray_,&dstBA,(DistributionMapping *)local_378,iVar9,
                         (int)local_368,(MFInfo *)&bx1,factory_00._M_head_impl);
      local_340->_vptr_AmrLevel = (_func_int **)fabarray_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,local_358);
      local_378 = fabarray_;
      if (bx1.bigend.vect._4_8_ == 0) {
        MFIter::MFIter((MFIter *)&bx1,fabarray_,true);
        if ((int)pbStack_300 < local_2f8) {
          local_2b8 = (local_360->geom).super_CoordSys.dx;
          local_260 = &(local_360->geom).prob_domain;
          local_2c0 = &local_360->level;
          do {
            ppbVar16 = &pbStack_300;
            lVar14 = (long)(int)pbStack_300;
            grid_no = (local_2e8->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar14];
            if (local_2e0 != (Vector<int,_std::allocator<int>_> *)0x0) {
              lVar14 = (long)(local_2e0->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar14];
            }
            local_298 = BaseFab<double>::dataPtr
                                  (*(BaseFab<double> **)
                                    (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) +
                                    lVar14 * 8),0);
            ppbVar15 = ppbVar16;
            if (local_2e0 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar15 = (pointer *)
                         ((local_2e0->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_300);
            }
            lVar14 = *(long *)(*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) +
                              (long)*(int *)ppbVar15 * 8);
            MFIter::growntilebox(&local_27c,(MFIter *)&bx1,-1000000);
            pDVar11 = local_358;
            n_der = DeriveRec::numDerive(local_358);
            ppbVar15 = ppbVar16;
            if (local_2e0 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar15 = (pointer *)
                         ((local_2e0->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_300);
            }
            local_2a0 = BaseFab<double>::dataPtr
                                  (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15]->
                                    super_BaseFab<double>,0);
            if (local_2e0 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar16 = (pointer *)
                         ((local_2e0->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_300);
            }
            local_328 = (Geometry *)(lVar14 + 0x24);
            pFVar3 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar16];
            local_348 = &(pFVar3->super_BaseFab<double>).domain;
            local_2a8 = &(pFVar3->super_BaseFab<double>).domain.bigend;
            n_state = DeriveRec::numState(pDVar11);
            pAVar4 = local_360;
            pSVar2 = (local_360->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_2b0 = (Box *)((long)(pSVar2 + index) + 0x10);
            local_368 = (int *)((long)(pSVar2 + index) + 0x1c);
            local_250 = DeriveRec::getBC(local_358);
            pRVar7 = local_2b8;
            RealBox::RealBox(&temp,&local_27c,local_2b8,local_260->xlo);
            pDVar11 = local_358;
            dt = (pAVar4->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pAVar4->level];
            p_Var17 = DeriveRec::derFunc(local_358);
            pGVar6 = local_328;
            pBVar5 = local_348;
            piVar13 = local_368;
            if (p_Var17 == (DeriveFunc)0x0) {
              p_Var18 = DeriveRec::derFunc3D(pDVar11);
              if (p_Var18 == (DeriveFunc3D)0x0) {
                Error_host("AmrLevel::derive: no function available");
              }
              else {
                piVar19 = DeriveRec::getBC3D(pDVar11);
                p_Var18 = DeriveRec::derFunc3D(pDVar11);
                (*p_Var18)(local_298,(int *)(lVar14 + 0x18),(int *)pGVar6,&n_der,local_2a0,
                           (int *)pBVar5,local_2a8->vect,&n_state,(int *)&local_27c,
                           local_27c.bigend.vect,(int *)local_2b0,piVar13,local_2b8,temp.xlo,
                           &time_local,&dt,piVar19,local_2c0,&grid_no);
              }
            }
            else {
              local_258 = DeriveRec::derFunc(pDVar11);
              (*local_258)(local_298,(int *)(lVar14 + 0x18),(int *)(lVar14 + 0x1c),
                           (int *)(lVar14 + 0x20),(int *)local_328,(int *)(lVar14 + 0x28),
                           (int *)(lVar14 + 0x2c),&n_der,local_2a0,(int *)local_348,
                           (pFVar3->super_BaseFab<double>).domain.smallend.vect + 1,
                           (pFVar3->super_BaseFab<double>).domain.smallend.vect + 2,local_2a8->vect,
                           (pFVar3->super_BaseFab<double>).domain.bigend.vect + 1,
                           (pFVar3->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                           (int *)&local_27c,local_27c.bigend.vect,(int *)local_2b0,local_368,pRVar7
                           ,temp.xlo,&time_local,&dt,local_250,local_2c0,&grid_no);
            }
            MFIter::operator++((MFIter *)&bx1);
            fabarray_ = local_378;
          } while ((int)pbStack_300 < local_2f8);
        }
      }
      else {
        (*(code *)bx1.bigend.vect._4_8_)(&bx1,&bx1,3);
        MFIter::MFIter((MFIter *)&bx1,fabarray_,true);
        if ((int)pbStack_300 < local_2f8) {
          local_328 = &local_360->geom;
          do {
            MFIter::growntilebox(&local_27c,(MFIter *)&bx1,(int)local_368);
            pDVar11 = local_358;
            ppbVar16 = &pbStack_300;
            if (local_2e0 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar16 = (pointer *)
                         ((local_2e0->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_300);
            }
            pFVar3 = *(FArrayBox **)
                      (*(long *)((long)&local_378[1].boxarray.m_bat.m_op + 0xc) +
                      (long)*(int *)ppbVar16 * 8);
            __args_4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar16];
            DeriveRec::derFuncFab((DeriveFuncFab *)&temp,local_358);
            piVar13 = DeriveRec::getBC(pDVar11);
            std::
            function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
            ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                          *)&temp,&local_27c,pFVar3,0,iVar9,__args_4,local_328,(double)local_348,
                         piVar13,local_360->level);
            if (temp.xlo[2] != 0.0) {
              (*(code *)temp.xlo[2])(&temp,&temp,3);
            }
            MFIter::operator++((MFIter *)&bx1);
          } while ((int)pbStack_300 < local_2f8);
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      BoxArray::~BoxArray(&dstBA);
    }
  }
  return (int)local_340;
}

Assistant:

std::unique_ptr<MultiFab>
AmrLevel::derive (const std::string& name, Real time, int ngrow)
{
    BL_ASSERT(ngrow >= 0);

    std::unique_ptr<MultiFab> mf;

    int index, scomp, ncomp;

    if (isStateVariable(name, index, scomp))
    {
        mf = std::make_unique<MultiFab>(state[index].boxArray(), dmap, 1, ngrow, MFInfo(), *m_factory);
        FillPatch(*this,*mf,ngrow,time,index,scomp,1,0);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0, index, scomp, ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        BoxArray dstBA(srcBA);
        dstBA.convert(rec->deriveType());

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA, dmap, rec->numState(), ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k, index, scomp, ncomp);
            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        const int dncomp = rec->numDerive();
        mf = std::make_unique<MultiFab>(dstBA, dmap, dncomp, ngrow, MFInfo(), *m_factory);

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(ngrow);
                FArrayBox& derfab = (*mf)[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                rec->derFuncFab()(bx, derfab, 0, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*mf,true); mfi.isValid(); ++mfi)
        {
            int         grid_no = mfi.index();
            Real*       ddat    = (*mf)[mfi].dataPtr();
            const int*  dlo     = (*mf)[mfi].loVect();
            const int*  dhi     = (*mf)[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox temp    (gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&grid_no);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&grid_no);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }

    return mf;
}